

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeanLoader_impl.hpp
# Opt level: O2

A * __thiscall hiberlite::BeanLoader::loadBean<A>(BeanLoader *this,bean_key *key)

{
  A *obj;
  A *bean;
  A *local_40;
  bean_key local_38;
  
  access::construct<hiberlite::BeanLoader,A>(this,&local_40);
  obj = local_40;
  bean_key::bean_key(&local_38,key);
  AVisitor<hiberlite::LoadBean>::startWalk<A>
            (&this->super_AVisitor<hiberlite::LoadBean>,obj,&local_38);
  shared_res<hiberlite::autoclosed_con>::~shared_res(&local_38.con);
  return local_40;
}

Assistant:

C* BeanLoader::loadBean(bean_key key)
{
	C* bean;
	construct(*this, &bean, static_cast<unsigned int>(0));
	startWalk(*bean, key);
	return bean;
}